

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

SequenceExprSyntax * __thiscall
slang::parsing::Parser::parseDelayedSequenceExpr(Parser *this,SequenceExprSyntax *first)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *delayVal;
  SelectorSyntax *range;
  SequenceExprSyntax *expr;
  undefined4 extraout_var;
  DelayedSequenceExprSyntax *pDVar3;
  EVP_PKEY_CTX *src;
  Token doubleHash;
  Token TVar4;
  SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL> elements;
  Token local_d8;
  SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> local_c8 [2];
  SequenceExprSyntax *local_88;
  DelayedSequenceElementSyntax *local_80;
  Token local_78;
  Token local_68;
  SyntaxNode *local_58;
  SyntaxNode *pSStack_50;
  pointer local_40;
  
  local_c8[0].data_ = (pointer)local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 5;
  local_88 = first;
  do {
    Token::Token(&local_68);
    Token::Token(&local_d8);
    Token::Token(&local_78);
    doubleHash = ParserBase::expect(&this->super_ParserBase,DoubleHash);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
    if (bVar1) {
      local_d8 = ParserBase::consume(&this->super_ParserBase);
      bVar1 = ParserBase::peek(&this->super_ParserBase,Star);
      if (bVar1) {
LAB_001dbc08:
        TVar4 = ParserBase::peek(&this->super_ParserBase,1);
        if (TVar4.kind != CloseBracket) goto LAB_001dbc48;
        local_68 = ParserBase::consume(&this->super_ParserBase);
        range = (SelectorSyntax *)0x0;
      }
      else {
        bVar1 = ParserBase::peek(&this->super_ParserBase,Plus);
        if (bVar1) goto LAB_001dbc08;
LAB_001dbc48:
        range = parseSequenceRange(this);
      }
      local_78 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
      delayVal = (ExpressionSyntax *)0x0;
    }
    else {
      delayVal = parsePrimaryExpression
                           (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
      range = (SelectorSyntax *)0x0;
    }
    expr = parseSequencePrimary(this);
    local_80 = slang::syntax::SyntaxFactory::delayedSequenceElement
                         (&this->factory,doubleHash,delayVal,local_d8,local_68,range,local_78,expr);
    SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*>::
    emplace_back<slang::syntax::DelayedSequenceElementSyntax*>
              ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*> *)local_c8,&local_80);
    bVar1 = ParserBase::peek(&this->super_ParserBase,DoubleHash);
    if (!bVar1) {
      iVar2 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::copy
                        (local_c8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
      local_40 = (pointer)CONCAT44(extraout_var,iVar2);
      local_68.info._0_4_ = 1;
      local_58 = (SyntaxNode *)0x0;
      pSStack_50 = (SyntaxNode *)0x0;
      local_68._0_8_ = &PTR_getChild_00623640;
      pDVar3 = slang::syntax::SyntaxFactory::delayedSequenceExpr
                         (&this->factory,local_88,
                          (SyntaxList<slang::syntax::DelayedSequenceElementSyntax> *)&local_68);
      if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
        operator_delete(local_c8[0].data_);
      }
      return &pDVar3->super_SequenceExprSyntax;
    }
  } while( true );
}

Assistant:

SequenceExprSyntax& Parser::parseDelayedSequenceExpr(SequenceExprSyntax* first) {
    SmallVector<DelayedSequenceElementSyntax*> elements;
    do {
        Token op, openBracket, closeBracket;
        SelectorSyntax* selector = nullptr;
        ExpressionSyntax* delayVal = nullptr;

        auto hash = expect(TokenKind::DoubleHash);

        if (peek(TokenKind::OpenBracket)) {
            openBracket = consume();
            if ((peek(TokenKind::Star) || peek(TokenKind::Plus)) &&
                peek(1).kind == TokenKind::CloseBracket) {
                op = consume();
            }
            else {
                selector = parseSequenceRange();
            }
            closeBracket = expect(TokenKind::CloseBracket);
        }
        else {
            delayVal = &parsePrimaryExpression(ExpressionOptions::None);
        }

        auto& expr = parseSequencePrimary();
        elements.push_back(&factory.delayedSequenceElement(hash, delayVal, openBracket, op,
                                                           selector, closeBracket, expr));

    } while (peek(TokenKind::DoubleHash));

    return factory.delayedSequenceExpr(first, elements.copy(alloc));
}